

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTests.cpp
# Opt level: O1

void __thiscall
agge::tests::PathGeneratorAdapterTests::PathIteratorRewoundOnStart(PathGeneratorAdapterTests *this)

{
  uint uVar1;
  mock_path_sink s;
  path p;
  point input [3];
  real_t local_f0;
  real_t local_ec;
  mock_path_sink local_e8;
  vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_> local_d0
  ;
  ulong local_b8;
  vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_> local_b0
  ;
  ulong local_98;
  string local_90;
  LocationInfo local_70;
  undefined1 local_48 [8];
  undefined1 auStack_40 [16];
  point pStack_30;
  point local_24;
  
  auStack_40._8_4_ = 23.0;
  auStack_40._12_4_ = 2;
  pStack_30.x = 3.0;
  pStack_30.y = 7.0;
  local_48._0_4_ = 10.0;
  local_48._4_4_ = 13.0;
  auStack_40._0_4_ = 1;
  auStack_40._4_4_ = 11.0;
  pStack_30.command = 2;
  std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>::
  vector<agge::tests::mocks::path::point*>
            ((vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>
              *)&local_b0,(point *)local_48,&local_24,(allocator_type *)&local_70);
  local_e8.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98 = (ulong)(local_b0.
                     super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                     ._M_impl.super__Vector_impl_data._M_finish !=
                    local_b0.
                    super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (local_98 <
      (ulong)(((long)local_b0.
                     super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_b0.
                     super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)) {
    local_98 = local_98 + 1;
  }
  std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  vector(&local_d0,&local_b0);
  local_b8 = 0;
  while( true ) {
    uVar1 = 0;
    if (local_b8 <
        (ulong)(((long)local_d0.
                       super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_d0.
                       super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)) {
      local_ec = local_d0.
                 super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_b8].x;
      local_f0 = local_d0.
                 super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_b8].y;
      uVar1 = local_d0.
              super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
              ._M_impl.super__Vector_impl_data._M_start[local_b8].command;
      local_b8 = local_b8 + 1;
    }
    if (uVar1 == 0) break;
    if ((uVar1 & 7) == 2) {
      mock_path_sink::line_to(&local_e8,local_ec,local_f0);
    }
    else if ((uVar1 & 7) == 1) {
      mock_path_sink::move_to(&local_e8,local_ec,local_f0);
    }
    if ((uVar1 & 0x20) != 0) {
      mock_path_sink::close_polygon(&local_e8);
    }
  }
  if (local_d0.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_70,&local_90,0x174);
  ut::
  are_equal<agge::tests::mocks::path::point,3ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            ((point (*) [3])local_48,&local_e8.points,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.filename._M_dataplus._M_p != &local_70.filename.field_2) {
    operator_delete(local_70.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_e8.points.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.points.
                    super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

test( PathIteratorRewoundOnStart )
			{
				// INIT
				mocks::path::point input[] = {
					{ 10.0f, 13.0f, path_command_move_to },
					{ 11.0f, 23.0f, path_command_line_to },
					{ 3.0f, 7.0f, path_command_line_to },
				};
				mocks::path p(input);
				mock_path_sink s;
				real_t dummy;

				p.vertex(&dummy, &dummy);
				p.vertex(&dummy, &dummy);

				// ACT
				add_path(s, p);

				// ASSERT
				assert_equal(input, s.points);
			}